

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

float indk::Position::getDistance(Position *L,Position *R)

{
  Error *this;
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if (L->DimensionsCount != R->DimensionsCount) {
    this = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this,10);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  fVar2 = 0.0;
  for (uVar1 = 0; L->DimensionsCount != uVar1; uVar1 = uVar1 + 1) {
    fVar3 = L->X[uVar1] - R->X[uVar1];
    fVar2 = fVar2 + fVar3 * fVar3;
  }
  if (0.0 <= fVar2) {
    return SQRT(fVar2);
  }
  fVar2 = sqrtf(fVar2);
  return fVar2;
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}